

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Fad<double> *pFVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  
  pFVar6 = (this->left_->fadexpr_).right_;
  pdVar8 = &pFVar6->defaultVal;
  if ((pFVar6->dx_).num_elts != 0) {
    pdVar8 = (pFVar6->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar8;
  dVar2 = (this->left_->fadexpr_).left_.constant_;
  pFVar7 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  dVar9 = sin(((pFVar7->fadexpr_).left_.constant_ * ((pFVar7->fadexpr_).right_)->val_) /
              (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar7 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar6 = (pFVar7->fadexpr_).right_;
  pdVar8 = &pFVar6->defaultVal;
  if ((pFVar6->dx_).num_elts != 0) {
    pdVar8 = (pFVar6->dx_).ptr_to_data + i;
  }
  dVar3 = (pFVar7->fadexpr_).left_.constant_;
  dVar4 = *pdVar8;
  dVar5 = (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar10 = cos((dVar3 * pFVar6->val_) / dVar5);
  return dVar10 * ((dVar4 * dVar3) / dVar5) *
         (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ +
         dVar9 * dVar1 * dVar2;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}